

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg3(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar5;
  Type *pTVar6;
  Type TVar7;
  FunctionBody *pFVar8;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot local_40;
  Type local_3a;
  RegSlot local_38;
  ProfileId profileId;
  OpCode op_local;
  
  local_40 = R2;
  profileId = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x4);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1b2,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0088cc36;
    *puVar5 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar8 = this->m_functionWrite;
    if (pFVar8 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0088cc36;
      *puVar5 = 0;
      pFVar8 = this->m_functionWrite;
    }
    local_38 = FunctionBody::MapRegSlot(pFVar8,R0);
    if (R1 != 0xffffffff) {
      pFVar8 = this->m_functionWrite;
      if (pFVar8 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_0088cc36;
        *puVar5 = 0;
        pFVar8 = this->m_functionWrite;
      }
      R1_00 = FunctionBody::MapRegSlot(pFVar8,R1);
      RVar2 = local_40;
      if (local_40 != 0xffffffff) {
        pFVar8 = this->m_functionWrite;
        if (pFVar8 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_0088cc36;
          *puVar5 = 0;
          pFVar8 = this->m_functionWrite;
        }
        R2_00 = FunctionBody::MapRegSlot(pFVar8,RVar2);
        local_3a = 0;
        bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
        RVar2 = local_38;
        if (bVar3) {
          if (op != Div_A) {
            if (op == IsIn) goto LAB_0088cb12;
            if (op != Rem_A) goto LAB_0088cb45;
          }
          TVar7 = this->m_functionWrite->profiledDivOrRemCount;
          if (TVar7 == 0xffff) {
LAB_0088cb45:
            bVar3 = false;
            goto LAB_0088cb51;
          }
          pTVar6 = &this->m_functionWrite->profiledDivOrRemCount;
        }
        else {
          if (op != IsIn) goto LAB_0088cb45;
LAB_0088cb12:
          TVar7 = this->m_functionWrite->profiledLdElemCount;
          if (TVar7 == 0xffff) {
            bVar3 = false;
            goto LAB_0088cb51;
          }
          pTVar6 = &this->m_functionWrite->profiledLdElemCount;
        }
        *pTVar6 = TVar7 + 1;
        local_3a = TVar7;
        OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
        bVar3 = true;
LAB_0088cb51:
        bVar4 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,profileId,RVar2,R1_00,R2_00);
        if (!bVar4) {
          bVar4 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,profileId,RVar2,R1_00,R2_00);
          if (!bVar4) {
            local_4c = RVar2;
            local_48 = R1_00;
            local_44 = R2_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId,this);
            Data::Write(&this->m_byteCodeData,&local_4c,0xc);
          }
        }
        if (bVar3) {
          Data::Write(&this->m_byteCodeData,&local_3a,2);
        }
        return;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_0088cc36:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        ProfileId profileId = 0;
        bool isProfiled = false;
        if ((DoDynamicProfileOpcode(FloatTypeSpecPhase) && (op == Js::OpCode::Div_A || op == Js::OpCode::Rem_A)) &&
            this->m_functionWrite->AllocProfiledDivOrRem(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        else if (op == Js::OpCode::IsIn && this->m_functionWrite->AllocProfiledLdElemId(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }

        MULTISIZE_LAYOUT_WRITE(Reg3, op, R0, R1, R2);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }